

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O3

timer_thread_unique_ptr_t __thiscall
so_5::create_timer_list_thread(so_5 *this,error_logger_shptr_t *logger)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
  *this_00;
  undefined8 *puVar2;
  error_logger_shptr_t *logger_00;
  error_logger_shptr_t local_88;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
  *local_60;
  _Any_data local_58;
  code *local_48;
  _Any_data local_38;
  code *local_28;
  
  this_00 = (basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
             *)operator_new(0xd0);
  local_78 = (logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Stack_70 = (logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
  p_Var1 = (logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  timers_details::create_error_logger_for_timertt_abi_cxx11_
            ((error_logger_for_timertt_t *)&local_38,(timers_details *)&local_78,logger_00);
  local_88.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var1 = (logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  timers_details::create_exception_handler_for_timertt_thread
            ((exception_handler_for_timertt_t *)&local_58,&local_88);
  timertt::details::
  basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
  ::
  basic_methods_impl_mixin<std::function<void(std::__cxx11::string_const&)>&,std::function<void(std::exception_const&)>&>
            (this_00,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_38,(function<void_(const_std::exception_&)> *)&local_58);
  this_00[200] = (basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
                  )0x0;
  local_60 = this_00;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_88.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  puVar2 = (undefined8 *)operator_new(0x10);
  *(undefined8 **)this = puVar2;
  *puVar2 = &PTR__actual_thread_t_00284c50;
  puVar2[1] = this_00;
  return (__uniq_ptr_data<so_5::timer_thread_t,_std::default_delete<so_5::timer_thread_t>,_true,_true>
          )(__uniq_ptr_data<so_5::timer_thread_t,_std::default_delete<so_5::timer_thread_t>,_true,_true>
            )this;
}

Assistant:

SO_5_FUNC timer_thread_unique_ptr_t
create_timer_list_thread(
	error_logger_shptr_t logger )
	{
		using timertt_thread_t = timers_details::timer_list_thread_t;
		using namespace timers_details;

		std::unique_ptr< timertt_thread_t > thread(
				new timertt_thread_t(
						create_error_logger_for_timertt( logger ),
						create_exception_handler_for_timertt_thread( logger ) ) );

		return timer_thread_unique_ptr_t(
				new actual_thread_t< timertt_thread_t >( std::move( thread ) ) );
	}